

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_0::generateRandomFrame
               (Frame *dst,
               vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
               *drawTypes,Random *rnd)

{
  pointer *ppDVar1;
  DrawCommand *__first;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *pvVar2;
  deRandom *rnd_00;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  ulong uVar7;
  pointer __result;
  DrawCommand *pDVar8;
  DrawCommand *pDVar9;
  int iVar10;
  int iVar11;
  allocator<deqp::egl::(anonymous_namespace)::DrawCommand> *__alloc;
  long lVar12;
  ColoredRect *this;
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
  *this_00;
  ulong uVar13;
  Vector<unsigned_char,_3> local_93;
  Frame *local_90;
  DrawType local_84;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *local_80;
  ulong local_78;
  Vector<int,_2> local_70;
  deRandom *local_68;
  DrawCommand drawCommand;
  ColoredRect coloredRect;
  
  uVar13 = 0;
  local_90 = dst;
  local_80 = drawTypes;
  local_68 = &rnd->m_rnd;
  do {
    rnd_00 = local_68;
    if ((ulong)((long)(local_80->
                      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_80->
                      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar13) {
      return;
    }
    iVar3 = de::Random::getInt((Random *)local_68,0,(dst->width + -1) / 8);
    local_84 = iVar3 << 2;
    iVar3 = de::Random::getInt((Random *)rnd_00,0,(local_90->height + -1) / 8);
    iVar10 = local_90->width + -1;
    iVar10 = de::Random::getInt((Random *)rnd_00,iVar10 / 8,iVar10 / 4);
    iVar11 = local_90->height + -1;
    iVar11 = de::Random::getInt((Random *)rnd_00,iVar11 / 8,iVar11 / 4);
    dVar4 = deRandom_getUint32(rnd_00);
    local_78 = uVar13;
    dVar5 = deRandom_getUint32(rnd_00);
    dst = local_90;
    dVar6 = deRandom_getUint32(rnd_00);
    uVar13 = local_78;
    pvVar2 = local_80;
    drawCommand.drawType = local_84;
    local_93.m_data[0] = (uchar)dVar4;
    local_93.m_data[1] = (uchar)dVar5;
    local_93.m_data[2] = (uchar)dVar6;
    this = &coloredRect;
    local_70.m_data[0] = iVar10 << 2;
    local_70.m_data[1] = iVar11 << 2;
    drawCommand.rect.bottomLeft.m_data[0] = iVar3 << 2;
    tcu::Vector<int,_2>::Vector(&this->bottomLeft,(Vector<int,_2> *)&drawCommand);
    tcu::Vector<int,_2>::Vector(&coloredRect.topRight,&local_70);
    tcu::Vector<unsigned_char,_3>::Vector(&coloredRect.color,&local_93);
    drawCommand.drawType =
         (pvVar2->
         super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
         )._M_impl.super__Vector_impl_data._M_start[uVar13];
    ColoredRect::ColoredRect(&drawCommand.rect,this);
    pDVar9 = (dst->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pDVar9 == (dst->draws).
                  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __first = (dst->draws).
                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = (long)pDVar9 - (long)__first;
      if (lVar12 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar7 = lVar12 / 0x18;
      uVar13 = uVar7;
      if (pDVar9 == __first) {
        uVar13 = 1;
      }
      this_00 = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 *)(uVar13 + uVar7);
      if ((_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
           *)0x555555555555554 < this_00) {
        this_00 = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                   *)0x555555555555555;
      }
      __alloc = (allocator<deqp::egl::(anonymous_namespace)::DrawCommand> *)(uVar13 + uVar7);
      if (CARRY8(uVar13,uVar7)) {
        this_00 = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                   *)0x555555555555555;
      }
      __result = std::
                 _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ::_M_allocate(this_00,(size_t)this);
      DrawCommand::DrawCommand((DrawCommand *)(lVar12 + (long)__result),&drawCommand);
      pDVar8 = std::
               __uninitialized_move_if_noexcept_a<deqp::egl::(anonymous_namespace)::DrawCommand*,deqp::egl::(anonymous_namespace)::DrawCommand*,std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>>
                         (__first,pDVar9,__result,__alloc);
      pDVar9 = std::
               __uninitialized_move_if_noexcept_a<deqp::egl::(anonymous_namespace)::DrawCommand*,deqp::egl::(anonymous_namespace)::DrawCommand*,std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>>
                         (pDVar9,pDVar9,pDVar8 + 1,__alloc);
      lVar12 = (long)(dst->draws).
                     super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
      std::
      _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
      ::_M_deallocate((_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                       *)__first,(pointer)(lVar12 / 0x18),lVar12 % 0x18);
      (dst->draws).
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      (dst->draws).
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish = pDVar9;
      (dst->draws).
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
      uVar13 = local_78;
    }
    else {
      DrawCommand::DrawCommand(pDVar9,&drawCommand);
      ppDVar1 = &(dst->draws).
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppDVar1 = *ppDVar1 + 1;
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void generateRandomFrame (Frame& dst, const vector<PartialUpdateTest::DrawType>& drawTypes, de::Random& rnd)
{
	for (size_t ndx = 0; ndx < drawTypes.size(); ndx++)
	{
		const int			x1			= rnd.getInt(0, (dst.width-1)/8) * 4;
		const int			y1			= rnd.getInt(0, (dst.height-1)/8) * 4;
		const int			x2			= rnd.getInt((dst.width-1)/8, (dst.width-1)/4) * 4;
		const int			y2			= rnd.getInt((dst.height-1)/8, (dst.height-1)/4) * 4;
		const GLubyte		r			= rnd.getUint8();
		const GLubyte		g			= rnd.getUint8();
		const GLubyte		b			= rnd.getUint8();
		const ColoredRect	coloredRect	(IVec2(x1, y1), IVec2(x2, y2), Color(r, g, b));
		const DrawCommand	drawCommand	(drawTypes[ndx], coloredRect);

		dst.draws.push_back(drawCommand);
	}
}